

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9Vfs_umask(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  int iValue;
  void *pvVar1;
  char *pcVar2;
  jx9_vfs *pVfs;
  int iNew;
  int iOld;
  jx9_value **apArg_local;
  int nArg_local;
  jx9_context *pCtx_local;
  
  pvVar1 = jx9_context_user_data(pCtx);
  if ((pvVar1 == (void *)0x0) || (*(long *)((long)pvVar1 + 0x120) == 0)) {
    pcVar2 = jx9_function_name(pCtx);
    jx9_context_throw_error_format
              (pCtx,2,"IO routine(%s) not implemented in the underlying VFS",pcVar2);
    jx9_result_int(pCtx,0);
  }
  else {
    pVfs._0_4_ = 0;
    if (0 < nArg) {
      pVfs._0_4_ = jx9_value_to_int(*apArg);
    }
    iValue = (**(code **)((long)pvVar1 + 0x120))((int)pVfs);
    jx9_result_int(pCtx,iValue);
  }
  return 0;
}

Assistant:

static int jx9Vfs_umask(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	int iOld, iNew;
	jx9_vfs *pVfs;
	/* Point to the underlying vfs */
	pVfs = (jx9_vfs *)jx9_context_user_data(pCtx);
	if( pVfs == 0 || pVfs->xUmask == 0 ){
		/* IO routine not implemented, return -1 */
		jx9_context_throw_error_format(pCtx, JX9_CTX_WARNING, 
			"IO routine(%s) not implemented in the underlying VFS", 
			jx9_function_name(pCtx)
			);
		jx9_result_int(pCtx, 0);
		return JX9_OK;
	}
	iNew = 0;
	if( nArg > 0 ){
		iNew = jx9_value_to_int(apArg[0]);
	}
	/* Perform the requested operation */
	iOld = pVfs->xUmask(iNew);
	/* Old mask */
	jx9_result_int(pCtx, iOld);
	return JX9_OK;
}